

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var __thiscall
BailOutRecord::EnsureArguments
          (BailOutRecord *this,InterpreterStackFrame *newInstance,JavascriptCallStackLayout *layout,
          ScriptContext *scriptContext,Var *pArgumentsObject)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var *pArgumentsObject_local;
  ScriptContext *scriptContext_local;
  JavascriptCallStackLayout *layout_local;
  InterpreterStackFrame *newInstance_local;
  BailOutRecord *this_local;
  
  if (((byte)this->globalBailOutRecordTable->field_0x2c >> 4 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x284,"(globalBailOutRecordTable->hasStackArgOpt)",
                       "globalBailOutRecordTable->hasStackArgOpt");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,StackArgFormalsOptPhase);
  if (bVar2) {
    Js::InterpreterStackFrame::OP_LdHeapArguments(newInstance,scriptContext);
  }
  else {
    Js::InterpreterStackFrame::CreateEmptyHeapArgumentsObject(newInstance,scriptContext);
  }
  if (*(long *)(newInstance + 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x28e,"(newInstance->m_arguments)","newInstance->m_arguments");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *pArgumentsObject = *(Var *)(newInstance + 0x40);
  return *(Var *)(newInstance + 0x40);
}

Assistant:

Js::Var BailOutRecord::EnsureArguments(Js::InterpreterStackFrame * newInstance, Js::JavascriptCallStackLayout * layout, Js::ScriptContext* scriptContext, Js::Var* pArgumentsObject) const
{
    Assert(globalBailOutRecordTable->hasStackArgOpt);
    if (PHASE_OFF1(Js::StackArgFormalsOptPhase))
    {
        newInstance->OP_LdHeapArguments(scriptContext);
    }
    else
    {
        newInstance->CreateEmptyHeapArgumentsObject(scriptContext);
    }

    Assert(newInstance->m_arguments);
    *pArgumentsObject = (Js::ArgumentsObject*)newInstance->m_arguments;
    return newInstance->m_arguments;
}